

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O2

void __thiscall
ThreadedReplayer::set_application_info
          (ThreadedReplayer *this,Hash param_1,VkApplicationInfo *app,
          VkPhysicalDeviceFeatures2 *features)

{
  VkPipelineCache *ppVVar1;
  VkValidationCacheEXT *ppVVar2;
  uint uVar3;
  VulkanDevice *pVVar4;
  DatabaseInterface *pDVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  VkResult VVar9;
  VulkanDevice *this_00;
  long lVar10;
  DatabaseInterface *pDVar11;
  FILE *pFVar12;
  size_type sVar13;
  size_t sVar14;
  uint i;
  long lVar15;
  char *__s;
  long in_FS_OFFSET;
  char uuid_string [33];
  string path;
  
  __s = uuid_string;
  if (((this->per_thread_data).
       super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
       ._M_impl.super__Vector_impl_data._M_start[*(uint *)(in_FS_OFFSET + -0x18)].expected_tag ==
       RESOURCE_APPLICATION_INFO) && (this->device_was_init == false)) {
    if (-1 < crash_fd) {
      write_all(crash_fd,"BEGIN_HEARTBEAT\n");
    }
    this->device_was_init = true;
    this_00 = (VulkanDevice *)operator_new(0x1318);
    Fossilize::VulkanDevice::VulkanDevice(this_00);
    pVVar4 = (this->device)._M_t.
             super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
             .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl;
    (this->device)._M_t.
    super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>.
    _M_t.
    super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
    .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl = this_00;
    if (pVVar4 != (VulkanDevice *)0x0) {
      (**(code **)(*(long *)pVVar4 + 8))();
    }
    (this->device_opts).application_info = app;
    (this->device_opts).features = features;
    (this->device_opts).want_pipeline_stats = (this->opts).pipeline_stats;
    lVar10 = std::chrono::_V2::steady_clock::now();
    bVar6 = Fossilize::VulkanDevice::init_device
                      ((this->device)._M_t.
                       super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                       .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl,
                       &this->device_opts);
    if (!bVar6) {
      fwrite("Fossilize ERROR: Failed to create Vulkan device, bailing ...\n",0x3d,1,_stderr);
      fflush(_stderr);
      exit(1);
    }
    Fossilize::VulkanDevice::set_validation_error_callback
              ((this->device)._M_t.
               super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
               .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl,
               on_validation_error,this);
    bVar7 = (this->opts).pipeline_stats;
    if (((bool)bVar7 == true) &&
       (((this->device)._M_t.
         super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
         ._M_t.
         super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
         .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->pipeline_stats ==
        false)) {
      fwrite("Fossilize INFO: Requested pipeline stats, but device does not support them. Disabling.\n"
             ,0x57,1,_stderr);
      fflush(_stderr);
      (this->opts).pipeline_stats = false;
      bVar7 = 0;
    }
    if (((this->opts).on_disk_module_identifier_path._M_string_length != 0) &&
       (pVVar4 = (this->device)._M_t.
                 super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                 .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl,
       pVVar4->supports_module_identifiers == true)) {
      for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
        sprintf(__s,"%02x",
                (ulong)(pVVar4->props).shader_module_identifier.shaderModuleIdentifierAlgorithmUUID
                       [lVar15]);
        __s = __s + 2;
      }
      if (-1 < crash_fd) {
        sprintf((char *)&path,"MODULE_UUID %s\n",uuid_string);
        bVar6 = write_all(crash_fd,(char *)&path);
        if (!bVar6) {
          _exit(2);
        }
      }
      std::__cxx11::string::string
                ((string *)&path,(string *)&(this->opts).on_disk_module_identifier_path);
      std::__cxx11::string::push_back((char)&path);
      std::__cxx11::string::append((char *)&path);
      std::__cxx11::string::append((char *)&path);
      pDVar11 = Fossilize::create_stream_archive_database(path._M_dataplus._M_p,Append);
      pDVar5 = (this->module_identifier_db)._M_t.
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      (this->module_identifier_db)._M_t.
      super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
      ._M_t.
      super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
      .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl = pDVar11;
      if (pDVar5 != (DatabaseInterface *)0x0) {
        (*pDVar5->_vptr_DatabaseInterface[1])();
        pDVar11 = (this->module_identifier_db)._M_t.
                  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      }
      iVar8 = (*pDVar11->_vptr_DatabaseInterface[2])(pDVar11);
      if ((char)iVar8 == '\0') {
        fwrite("Fossilize WARN: Failed to prepare module identifier database. Disabling identifiers.\n"
               ,0x55,1,_stderr);
        fflush(_stderr);
        pDVar5 = (this->module_identifier_db)._M_t.
                 super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                 .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
        (this->module_identifier_db)._M_t.
        super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
        ._M_t.
        super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
        .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
             (DatabaseInterface *)0x0;
        if (pDVar5 != (DatabaseInterface *)0x0) {
          (*pDVar5->_vptr_DatabaseInterface[1])();
        }
      }
      std::__cxx11::string::_M_dispose();
      bVar7 = (this->opts).pipeline_stats;
    }
    if ((bVar7 & 1) != 0) {
      std::operator+(&path,&(this->opts).pipeline_stats_path,".__tmp.foz");
      pDVar11 = Fossilize::create_stream_archive_database(path._M_dataplus._M_p,OverWrite);
      pDVar5 = (this->pipeline_stats_db)._M_t.
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      (this->pipeline_stats_db)._M_t.
      super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
      ._M_t.
      super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
      .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl = pDVar11;
      if (pDVar5 != (DatabaseInterface *)0x0) {
        (*pDVar5->_vptr_DatabaseInterface[1])();
        pDVar11 = (this->pipeline_stats_db)._M_t.
                  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      }
      iVar8 = (*pDVar11->_vptr_DatabaseInterface[2])(pDVar11);
      if ((char)iVar8 == '\0') {
        fwrite("Fossilize WARN: Failed to prepare stats database. Disabling pipeline stats.\n",0x4c,
               1,_stderr);
        fflush(_stderr);
        pDVar5 = (this->pipeline_stats_db)._M_t.
                 super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                 .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
        (this->pipeline_stats_db)._M_t.
        super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
        ._M_t.
        super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
        .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
             (DatabaseInterface *)0x0;
        if (pDVar5 != (DatabaseInterface *)0x0) {
          (*pDVar5->_vptr_DatabaseInterface[1])();
        }
        (this->opts).pipeline_stats = false;
      }
      std::__cxx11::string::_M_dispose();
    }
    if ((this->opts).on_disk_pipeline_cache_path._M_string_length != 0) {
      path._M_string_length = 0;
      path.field_2._M_allocated_capacity = 0;
      path.field_2._8_8_ = 0;
      path._M_dataplus._M_p = (pointer)0x11;
      uuid_string[0] = '\0';
      uuid_string[1] = '\0';
      uuid_string[2] = '\0';
      uuid_string[3] = '\0';
      uuid_string[4] = '\0';
      uuid_string[5] = '\0';
      uuid_string[6] = '\0';
      uuid_string[7] = '\0';
      uuid_string[8] = '\0';
      uuid_string[9] = '\0';
      uuid_string[10] = '\0';
      uuid_string[0xb] = '\0';
      uuid_string[0xc] = '\0';
      uuid_string[0xd] = '\0';
      uuid_string[0xe] = '\0';
      uuid_string[0xf] = '\0';
      uuid_string[0x10] = '\0';
      uuid_string[0x11] = '\0';
      uuid_string[0x12] = '\0';
      uuid_string[0x13] = '\0';
      uuid_string[0x14] = '\0';
      uuid_string[0x15] = '\0';
      uuid_string[0x16] = '\0';
      uuid_string[0x17] = '\0';
      pFVar12 = fopen((this->opts).on_disk_pipeline_cache_path._M_dataplus._M_p,"rb");
      if (pFVar12 != (FILE *)0x0) {
        fseek(pFVar12,0,2);
        sVar13 = ftell(pFVar12);
        rewind(pFVar12);
        if (sVar13 != 0) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)uuid_string,sVar13);
          sVar14 = fread((void *)uuid_string._0_8_,1,sVar13,pFVar12);
          if (sVar14 == sVar13) {
            bVar6 = validate_pipeline_cache_header
                              (this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    uuid_string);
            if (bVar6) {
              path.field_2._8_8_ = uuid_string._8_8_ - uuid_string._0_8_;
            }
            else {
              fwrite("Fossilize INFO: Failed to validate pipeline cache. Creating a blank one.\n",
                     0x49,1,_stderr);
              fflush(_stderr);
            }
          }
        }
      }
      ppVVar1 = &this->disk_pipeline_cache;
      VVar9 = (*vkCreatePipelineCache)
                        (((this->device)._M_t.
                          super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                          .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                         device,(VkPipelineCacheCreateInfo *)&path,(VkAllocationCallbacks *)0x0,
                         ppVVar1);
      if (VVar9 != VK_SUCCESS) {
        fwrite("Fossilize WARN: Failed to create pipeline cache, trying to create a blank one.\n",
               0x4f,1,_stderr);
        fflush(_stderr);
        path.field_2._8_8_ = 0;
        VVar9 = (*vkCreatePipelineCache)
                          (((this->device)._M_t.
                            super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                            .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                           device,(VkPipelineCacheCreateInfo *)&path,(VkAllocationCallbacks *)0x0,
                           ppVVar1);
        if (VVar9 != VK_SUCCESS) {
          fwrite("Fossilize ERROR: Failed to create pipeline cache.\n",0x32,1,_stderr);
          fflush(_stderr);
          *ppVVar1 = (VkPipelineCache)0x0;
        }
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)uuid_string);
    }
    if ((this->opts).on_disk_validation_cache_path._M_string_length != 0) {
      if (((this->device)._M_t.
           super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
           .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->validation_cache
          == true) {
        path._M_string_length = 0;
        path.field_2._M_allocated_capacity = 0;
        path.field_2._8_8_ = 0;
        path._M_dataplus._M_p = (pointer)0x3b9d3b00;
        uuid_string[0] = '\0';
        uuid_string[1] = '\0';
        uuid_string[2] = '\0';
        uuid_string[3] = '\0';
        uuid_string[4] = '\0';
        uuid_string[5] = '\0';
        uuid_string[6] = '\0';
        uuid_string[7] = '\0';
        uuid_string[8] = '\0';
        uuid_string[9] = '\0';
        uuid_string[10] = '\0';
        uuid_string[0xb] = '\0';
        uuid_string[0xc] = '\0';
        uuid_string[0xd] = '\0';
        uuid_string[0xe] = '\0';
        uuid_string[0xf] = '\0';
        uuid_string[0x10] = '\0';
        uuid_string[0x11] = '\0';
        uuid_string[0x12] = '\0';
        uuid_string[0x13] = '\0';
        uuid_string[0x14] = '\0';
        uuid_string[0x15] = '\0';
        uuid_string[0x16] = '\0';
        uuid_string[0x17] = '\0';
        pFVar12 = fopen((this->opts).on_disk_validation_cache_path._M_dataplus._M_p,"rb");
        if (pFVar12 != (FILE *)0x0) {
          fseek(pFVar12,0,2);
          sVar13 = ftell(pFVar12);
          rewind(pFVar12);
          if (sVar13 != 0) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)uuid_string,sVar13);
            sVar14 = fread((void *)uuid_string._0_8_,1,sVar13,pFVar12);
            if (sVar14 == sVar13) {
              bVar6 = validate_validation_cache_header
                                (this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      uuid_string);
              if (bVar6) {
                path.field_2._8_8_ = uuid_string._8_8_ - uuid_string._0_8_;
              }
              else {
                fwrite("Fossilize INFO: Failed to validate validation cache. Creating a blank one.\n"
                       ,0x4b,1,_stderr);
                fflush(_stderr);
              }
            }
          }
        }
        ppVVar2 = &this->validation_cache;
        VVar9 = (*vkCreateValidationCacheEXT)
                          (((this->device)._M_t.
                            super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                            .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                           device,(VkValidationCacheCreateInfoEXT *)&path,
                           (VkAllocationCallbacks *)0x0,ppVVar2);
        if (VVar9 != VK_SUCCESS) {
          fwrite("Fossilize WARN: Failed to create validation cache, trying to create a blank one.\n"
                 ,0x51,1,_stderr);
          fflush(_stderr);
          path.field_2._8_8_ = 0;
          VVar9 = (*vkCreateValidationCacheEXT)
                            (((this->device)._M_t.
                              super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                              .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)
                             ->device,(VkValidationCacheCreateInfoEXT *)&path,
                             (VkAllocationCallbacks *)0x0,ppVVar2);
          if (VVar9 != VK_SUCCESS) {
            fwrite("Fossilize ERROR: Failed to create validation cache.\n",0x34,1,_stderr);
            fflush(_stderr);
            *ppVVar2 = (VkValidationCacheEXT)0x0;
          }
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)uuid_string);
      }
      else {
        fwrite("Fossilize ERROR: Requested validation cache, but validation layers do not support this extension.\n"
               ,0x62,1,_stderr);
        fflush(_stderr);
      }
    }
    if ((this->opts).replayer_cache_path._M_string_length != 0) {
      bVar6 = init_replayer_cache(this);
      if (!bVar6) {
        fwrite("Fossilize WARN: Failed to initialize replayer cache. Ignoring!\n",0x3f,1,_stderr);
        fflush(_stderr);
      }
    }
    lVar15 = std::chrono::_V2::steady_clock::now();
    fprintf(_stderr,"Fossilize INFO: Creating Vulkan device took: %ld ms\n",
            (lVar15 - lVar10) / 1000000);
    fflush(_stderr);
    if (app != (VkApplicationInfo *)0x0) {
      fwrite("Fossilize INFO: Replaying for application:\n",0x2b,1,_stderr);
      fflush(_stderr);
      uVar3 = app->apiVersion;
      fprintf(_stderr,"Fossilize INFO:   apiVersion: %u.%u.%u\n",(ulong)(uVar3 >> 0x16),
              (ulong)(uVar3 >> 0xc & 0x3ff),(ulong)(uVar3 & 0xfff));
      fflush(_stderr);
      fprintf(_stderr,"Fossilize INFO:   engineVersion: %u\n",(ulong)app->engineVersion);
      fflush(_stderr);
      fprintf(_stderr,"Fossilize INFO:   applicationVersion: %u\n",(ulong)app->applicationVersion);
      fflush(_stderr);
      if (app->pEngineName != (char *)0x0) {
        fprintf(_stderr,"Fossilize INFO:   engineName: %s\n");
        fflush(_stderr);
      }
      if (app->pApplicationName != (char *)0x0) {
        fprintf(_stderr,"Fossilize INFO:   applicationName: %s\n");
        fflush(_stderr);
      }
    }
  }
  return;
}

Assistant:

void set_application_info(Hash, const VkApplicationInfo *app, const VkPhysicalDeviceFeatures2 *features) override
	{
		// TODO: Could use this to create multiple VkDevices for replay as necessary if app changes.
		if (get_per_thread_data().expected_tag != RESOURCE_APPLICATION_INFO)
			return;

		if (!device_was_init)
		{
			// From this point on, we expect forward progress in finite time.
			// If the Vulkan driver is unstable and deadlocks, we'll be able to detect it and kill the process.
			begin_heartbeat();

			// Now we can init the device with correct app info.
			device_was_init = true;
			device.reset(new VulkanDevice);
			device_opts.application_info = app;
			device_opts.features = features;
			device_opts.want_pipeline_stats = opts.pipeline_stats;
			auto start_device = chrono::steady_clock::now();
			if (!device->init_device(device_opts))
			{
				LOGE("Failed to create Vulkan device, bailing ...\n");
				exit(EXIT_FAILURE);
			}

			device->set_validation_error_callback(on_validation_error, this);

			if (opts.pipeline_stats && !device->has_pipeline_stats())
			{
				LOGI("Requested pipeline stats, but device does not support them. Disabling.\n");
				opts.pipeline_stats = false;
			}

			if (!opts.on_disk_module_identifier_path.empty() && device->module_identifiers_enabled())
			{
				auto &props = device->get_module_identifier_properties();
				char uuid_string[2 * VK_UUID_SIZE + 1];
				for (unsigned i = 0; i < VK_UUID_SIZE; i++)
					sprintf(uuid_string + 2 * i, "%02x", props.shaderModuleIdentifierAlgorithmUUID[i]);

				report_module_uuid(uuid_string);

				auto path = opts.on_disk_module_identifier_path;
				path += '.';
				path += uuid_string;
				path += ".foz";
				module_identifier_db.reset(create_stream_archive_database(path.c_str(), DatabaseMode::Append));
				if (!module_identifier_db->prepare())
				{
					LOGW("Failed to prepare module identifier database. Disabling identifiers.\n");
					module_identifier_db.reset();
				}
			}

			if (opts.pipeline_stats)
			{
				auto foz_path = opts.pipeline_stats_path + ".__tmp.foz";
				pipeline_stats_db.reset(create_stream_archive_database(foz_path.c_str(), DatabaseMode::OverWrite));
				if (!pipeline_stats_db->prepare())
				{
					LOGW("Failed to prepare stats database. Disabling pipeline stats.\n");
					pipeline_stats_db.reset();
					opts.pipeline_stats = false;
				}
			}

			if (!opts.on_disk_pipeline_cache_path.empty())
			{
				VkPipelineCacheCreateInfo info = { VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO };
				vector<uint8_t> on_disk_cache;

				// Try to load on-disk cache.
				FILE *file = fopen(opts.on_disk_pipeline_cache_path.c_str(), "rb");
				if (file)
				{
					fseek(file, 0, SEEK_END);
					size_t len = ftell(file);
					rewind(file);

					if (len != 0)
					{
						on_disk_cache.resize(len);
						if (fread(on_disk_cache.data(), 1, len, file) == len)
						{
							if (validate_pipeline_cache_header(on_disk_cache))
							{
								info.pInitialData = on_disk_cache.data();
								info.initialDataSize = on_disk_cache.size();
							}
							else
								LOGI("Failed to validate pipeline cache. Creating a blank one.\n");
						}
					}
				}

				if (vkCreatePipelineCache(device->get_device(), &info, nullptr, &disk_pipeline_cache) != VK_SUCCESS)
				{
					LOGW("Failed to create pipeline cache, trying to create a blank one.\n");
					info.initialDataSize = 0;
					info.pInitialData = nullptr;
					if (vkCreatePipelineCache(device->get_device(), &info, nullptr, &disk_pipeline_cache) != VK_SUCCESS)
					{
						LOGE("Failed to create pipeline cache.\n");
						disk_pipeline_cache = VK_NULL_HANDLE;
					}
				}
			}

			if (!opts.on_disk_validation_cache_path.empty())
			{
				if (device->has_validation_cache())
				{
					VkValidationCacheCreateInfoEXT info = {VK_STRUCTURE_TYPE_VALIDATION_CACHE_CREATE_INFO_EXT };
					vector<uint8_t> on_disk_cache;

					FILE *file = fopen(opts.on_disk_validation_cache_path.c_str(), "rb");
					if (file)
					{
						fseek(file, 0, SEEK_END);
						size_t len = ftell(file);
						rewind(file);

						if (len != 0)
						{
							on_disk_cache.resize(len);
							if (fread(on_disk_cache.data(), 1, len, file) == len)
							{
								if (validate_validation_cache_header(on_disk_cache))
								{
									info.pInitialData = on_disk_cache.data();
									info.initialDataSize = on_disk_cache.size();
								}
								else
									LOGI("Failed to validate validation cache. Creating a blank one.\n");
							}
						}
					}

					if (vkCreateValidationCacheEXT(device->get_device(), &info, nullptr, &validation_cache) != VK_SUCCESS)
					{
						LOGW("Failed to create validation cache, trying to create a blank one.\n");
						info.initialDataSize = 0;
						info.pInitialData = nullptr;
						if (vkCreateValidationCacheEXT(device->get_device(), &info, nullptr, &validation_cache) != VK_SUCCESS)
						{
							LOGE("Failed to create validation cache.\n");
							validation_cache = VK_NULL_HANDLE;
						}
					}
				}
				else
				{
					LOGE("Requested validation cache, but validation layers do not support this extension.\n");
				}
			}

			if (!opts.replayer_cache_path.empty())
				if (!init_replayer_cache())
					LOGW("Failed to initialize replayer cache. Ignoring!\n");

			auto end_device = chrono::steady_clock::now();
			long time_ms = chrono::duration_cast<chrono::milliseconds>(end_device - start_device).count();
			LOGI("Creating Vulkan device took: %ld ms\n", time_ms);

			if (app)
			{
				LOGI("Replaying for application:\n");
				LOGI("  apiVersion: %u.%u.%u\n",
				     VK_VERSION_MAJOR(app->apiVersion),
				     VK_VERSION_MINOR(app->apiVersion),
				     VK_VERSION_PATCH(app->apiVersion));
				LOGI("  engineVersion: %u\n", app->engineVersion);
				LOGI("  applicationVersion: %u\n", app->applicationVersion);
				if (app->pEngineName)
					LOGI("  engineName: %s\n", app->pEngineName);
				if (app->pApplicationName)
					LOGI("  applicationName: %s\n", app->pApplicationName);
			}
		}
	}